

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nativefunction.cpp
# Opt level: O0

void sos::NativeFunction::equals(VariableStack *stack)

{
  __type item;
  string local_50;
  string local_30;
  VariableStack *local_10;
  VariableStack *stack_local;
  
  local_10 = stack;
  VariableStack::take_abi_cxx11_(&local_30,stack);
  VariableStack::take_abi_cxx11_(&local_50,local_10);
  item = std::operator==(&local_30,&local_50);
  VariableStack::load(stack,item);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void sos::NativeFunction::equals(sos::VariableStack *stack) {
    stack->load(stack->take() == stack->take());
}